

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_dlba_encoder.hpp
# Opt level: O3

void __thiscall
duckdb::DlbaEncoder::BeginWrite<duckdb::string_t>
          (DlbaEncoder *this,Allocator *allocator,WriteStream *writer,string_t *first_value)

{
  _Head_base<0UL,_duckdb::MemoryStream_*,_false> _Var1;
  data_ptr_t pdVar2;
  _Head_base<0UL,_duckdb::MemoryStream_*,_false> this_00;
  char *pcVar3;
  idx_t iVar4;
  AllocatedData local_48;
  
  iVar4 = this->total_string_size + 1;
  pdVar2 = Allocator::AllocateData(allocator,iVar4);
  AllocatedData::AllocatedData(&local_48,allocator,pdVar2,iVar4);
  AllocatedData::operator=(&this->buffer,&local_48);
  AllocatedData::~AllocatedData(&local_48);
  pdVar2 = (this->buffer).pointer;
  iVar4 = (this->buffer).allocated_size;
  this_00._M_head_impl = (MemoryStream *)operator_new(0x30);
  MemoryStream::MemoryStream(this_00._M_head_impl,pdVar2,iVar4);
  _Var1._M_head_impl =
       (this->stream).
       super_unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>_>._M_t.
       super___uniq_ptr_impl<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::MemoryStream_*,_std::default_delete<duckdb::MemoryStream>_>.
       super__Head_base<0UL,_duckdb::MemoryStream_*,_false>._M_head_impl;
  (this->stream).super_unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>_>.
  _M_t.super___uniq_ptr_impl<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::MemoryStream_*,_std::default_delete<duckdb::MemoryStream>_>.
  super__Head_base<0UL,_duckdb::MemoryStream_*,_false>._M_head_impl = this_00._M_head_impl;
  if (_Var1._M_head_impl != (MemoryStream *)0x0) {
    (**(code **)(*(long *)&(_Var1._M_head_impl)->super_WriteStream + 0x10))();
  }
  local_48.allocator.ptr = (Allocator *)(ulong)(first_value->value).pointer.length;
  DbpEncoder::BeginWriteInternal(&this->dbp_encoder,writer,(int64_t *)&local_48);
  _Var1._M_head_impl =
       (this->stream).
       super_unique_ptr<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>_>._M_t.
       super___uniq_ptr_impl<duckdb::MemoryStream,_std::default_delete<duckdb::MemoryStream>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::MemoryStream_*,_std::default_delete<duckdb::MemoryStream>_>.
       super__Head_base<0UL,_duckdb::MemoryStream_*,_false>._M_head_impl;
  if ((first_value->value).pointer.length < 0xd) {
    pcVar3 = (char *)((long)&first_value->value + 4);
  }
  else {
    pcVar3 = (first_value->value).pointer.ptr;
  }
  (*(code *)*((_Var1._M_head_impl)->super_WriteStream)._vptr_WriteStream)(_Var1._M_head_impl,pcVar3)
  ;
  return;
}

Assistant:

inline void DlbaEncoder::BeginWrite(Allocator &allocator, WriteStream &writer, const string_t &first_value) {
	buffer = allocator.Allocate(total_string_size + 1);
	stream = make_unsafe_uniq<MemoryStream>(buffer.get(), buffer.GetSize());
	dbp_encoder.BeginWrite(writer, UnsafeNumericCast<int64_t>(first_value.GetSize()));
	stream->WriteData(const_data_ptr_cast(first_value.GetData()), first_value.GetSize());
}